

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

void Nf_ObjPrepareBuf(Nf_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int c;
  Nf_Mat_t *pNVar3;
  Nf_Mat_t *pNVar4;
  Nf_Mat_t *pNVar5;
  Nf_Mat_t *pNVar6;
  Nf_Mat_t *pNVar7;
  Nf_Obj_t *__s;
  float fVar8;
  Nf_Mat_t *pAn;
  Nf_Mat_t *pDn;
  Nf_Mat_t *pAp;
  Nf_Mat_t *pDp;
  Nf_Mat_t *pDf;
  int iFanin;
  int iObj;
  Gia_Obj_t *pObj_local;
  Nf_Man_t *p_local;
  
  iVar1 = Gia_ObjId(p->pGia,pObj);
  iVar2 = Gia_ObjFaninId0(pObj,iVar1);
  c = Gia_ObjFaninC0(pObj);
  pNVar3 = Nf_ObjMatchD(p,iVar2,c);
  pNVar4 = Nf_ObjMatchD(p,iVar1,0);
  pNVar5 = Nf_ObjMatchA(p,iVar1,0);
  pNVar6 = Nf_ObjMatchD(p,iVar1,1);
  pNVar7 = Nf_ObjMatchA(p,iVar1,1);
  iVar2 = Gia_ObjIsBuf(pObj);
  if (iVar2 != 0) {
    __s = Nf_ManObj(p,iVar1);
    memset(__s,0,0x40);
    iVar1 = pNVar3->D;
    pNVar5->D = iVar1;
    pNVar4->D = iVar1;
    fVar8 = pNVar3->F;
    pNVar5->F = fVar8;
    pNVar4->F = fVar8;
    *(uint *)pNVar4 = *(uint *)pNVar4 & 0x7fffffff | 0x80000000;
    iVar1 = pNVar3->D + p->InvDelayI;
    pNVar7->D = iVar1;
    pNVar6->D = iVar1;
    fVar8 = pNVar3->F + p->InvAreaF;
    pNVar7->F = fVar8;
    pNVar6->F = fVar8;
    *(uint *)pNVar7 = *(uint *)pNVar7 & 0xbfffffff | 0x40000000;
    *(uint *)pNVar6 = *(uint *)pNVar6 & 0xbfffffff | 0x40000000;
    *(uint *)pNVar6 = *(uint *)pNVar6 & 0x7fffffff | 0x80000000;
    return;
  }
  __assert_fail("Gia_ObjIsBuf(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                ,0x4bc,"void Nf_ObjPrepareBuf(Nf_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Nf_ObjPrepareBuf( Nf_Man_t * p, Gia_Obj_t * pObj )
{
    // get fanin info
    int iObj = Gia_ObjId( p->pGia, pObj );
    int iFanin = Gia_ObjFaninId0( pObj, iObj );
    Nf_Mat_t * pDf = Nf_ObjMatchD( p, iFanin, Gia_ObjFaninC0(pObj) );
    //Nf_Mat_t * pAf = Nf_ObjMatchA( p, iFanin, Gia_ObjFaninC0(pObj) );
    // set the direct phase
    Nf_Mat_t * pDp = Nf_ObjMatchD( p, iObj, 0 );
    Nf_Mat_t * pAp = Nf_ObjMatchA( p, iObj, 0 );
    Nf_Mat_t * pDn = Nf_ObjMatchD( p, iObj, 1 );
    Nf_Mat_t * pAn = Nf_ObjMatchA( p, iObj, 1 );
    assert( Gia_ObjIsBuf(pObj) );
    memset( Nf_ManObj(p, iObj), 0, sizeof(Nf_Obj_t) );
    // set the direct phase
    pDp->D = pAp->D = pDf->D;
    pDp->F = pAp->F = pDf->F; // do not pass flow???
    pDp->fBest = 1;
    // set the inverted phase
    pDn->D = pAn->D = pDf->D + p->InvDelayI;
    pDn->F = pAn->F = pDf->F + p->InvAreaF;
    pDn->fCompl = pAn->fCompl = 1;
    pDn->fBest = 1;
}